

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void bssl::SSL_SESSION_list_remove(SSL_CTX *ctx,SSL_SESSION *session)

{
  SSL_SESSION *session_local;
  SSL_CTX *ctx_local;
  
  if ((session->next != (SSL_SESSION *)0x0) && (session->prev != (SSL_SESSION *)0x0)) {
    if (session->next == (SSL_SESSION *)&ctx->session_cache_tail) {
      if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
        ctx->session_cache_head = (SSL_SESSION *)0x0;
        ctx->session_cache_tail = (SSL_SESSION *)0x0;
      }
      else {
        ctx->session_cache_tail = session->prev;
        session->prev->next = (SSL_SESSION *)&ctx->session_cache_tail;
      }
    }
    else if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
      ctx->session_cache_head = session->next;
      session->next->prev = (SSL_SESSION *)&ctx->session_cache_head;
    }
    else {
      session->next->prev = session->prev;
      session->prev->next = session->next;
    }
    session->next = (SSL_SESSION *)0x0;
    session->prev = (SSL_SESSION *)0x0;
  }
  return;
}

Assistant:

static void SSL_SESSION_list_remove(SSL_CTX *ctx, SSL_SESSION *session) {
  if (session->next == NULL || session->prev == NULL) {
    return;
  }

  if (session->next == (SSL_SESSION *)&ctx->session_cache_tail) {
    // last element in list
    if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
      // only one element in list
      ctx->session_cache_head = NULL;
      ctx->session_cache_tail = NULL;
    } else {
      ctx->session_cache_tail = session->prev;
      session->prev->next = (SSL_SESSION *)&(ctx->session_cache_tail);
    }
  } else {
    if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
      // first element in list
      ctx->session_cache_head = session->next;
      session->next->prev = (SSL_SESSION *)&(ctx->session_cache_head);
    } else {  // middle of list
      session->next->prev = session->prev;
      session->prev->next = session->next;
    }
  }
  session->prev = session->next = NULL;
}